

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O0

int Abc_NodeIsXnor2(Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  byte local_21;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNode_local;
  
  pNtk_00 = pNode->pNtk;
  iVar1 = Abc_NtkIsNetlist(pNtk_00);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/io/ioWriteBook.c"
                  ,0x3d6,"int Abc_NodeIsXnor2(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 != 0) {
    iVar1 = Abc_ObjFaninNum(pNode);
    if (iVar1 == 2) {
      iVar1 = Abc_NtkHasSop(pNtk_00);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/io/ioWriteBook.c"
                      ,0x3dc,"int Abc_NodeIsXnor2(Abc_Obj_t *)");
      }
      iVar1 = strcmp((char *)(pNode->field_5).pData,"11 1\n00 1\n");
      local_21 = 1;
      if (iVar1 != 0) {
        iVar1 = strcmp((char *)(pNode->field_5).pData,"00 1\n11 1\n");
        local_21 = iVar1 != 0 ^ 0xff;
      }
      pNode_local._4_4_ = (uint)(local_21 & 1);
    }
    else {
      pNode_local._4_4_ = 0;
    }
    return pNode_local._4_4_;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/io/ioWriteBook.c"
                ,0x3d7,"int Abc_NodeIsXnor2(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeIsXnor2( Abc_Obj_t * pNode )
{
    Abc_Ntk_t * pNtk = pNode->pNtk;
    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_ObjIsNode(pNode) ); 
    if ( Abc_ObjFaninNum(pNode) != 2 )
        return 0;
    if ( Abc_NtkHasSop(pNtk) )
	return ( !strcmp(((char *)pNode->pData), "11 1\n00 1\n") || !strcmp(((char *)pNode->pData), "00 1\n11 1\n") );
    assert( 0 );
    return 0;
}